

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.cpp
# Opt level: O2

void sdf::RenderNormal(Affine3d *transformation,int rows,int cols,Vector4f *cam_params,int max_steps
                      ,float max_ray_length,float precision,
                      vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives,
                      Mat *Normals)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double local_1c0;
  Matrix<double,_3,_1,_0,_3,_1> local_168;
  double local_150;
  Vector3d camera;
  Vector3d ret;
  Vector3d normal_vector;
  Mat Nmap;
  long local_b0;
  long *local_78;
  Vector3d p;
  Vector3d viewAxis;
  
  cv::Mat::Mat(&Nmap,rows,cols,0x15);
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  Eigen::internal::
  transform_right_product_impl<Eigen::Transform<double,_3,_2,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1>
  ::run(&camera,transformation,&local_168);
  normal_vector.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = 0.0;
  normal_vector.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 0.0;
  normal_vector.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 1.000000000001;
  Eigen::internal::
  transform_right_product_impl<Eigen::Transform<double,_3,_2,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1>
  ::run((ResultType *)&p,transformation,(Matrix<double,_3,_1,_0,_3,_1> *)&normal_vector);
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)&camera;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)&p;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::normalized(&viewAxis,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_168);
  uVar9 = (ulong)(uint)cols;
  if (cols < 1) {
    uVar9 = 0;
  }
  uVar7 = (ulong)(uint)rows;
  if (rows < 1) {
    uVar7 = 0;
  }
  uVar8 = 0;
  do {
    if (uVar8 == uVar7) {
      cv::Mat::operator=(Normals,&Nmap);
      cv::Mat::~Mat(&Nmap);
      return;
    }
    for (uVar5 = 0; uVar5 != uVar9; uVar5 = uVar5 + 1) {
      uVar1 = *(undefined8 *)
               ((cam_params->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
                m_data.array + 2);
      auVar11._0_8_ = (double)((float)(int)uVar5 - (float)uVar1);
      auVar11._8_8_ = (double)((float)(int)uVar8 - (float)((ulong)uVar1 >> 0x20));
      uVar1 = *(undefined8 *)
               (cam_params->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
               m_data.array;
      dVar12 = (double)(float)((ulong)uVar1 >> 0x20);
      auVar2._8_4_ = SUB84(dVar12,0);
      auVar2._0_8_ = (double)(float)uVar1;
      auVar2._12_4_ = (int)((ulong)dVar12 >> 0x20);
      ret.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._0_16_
           = divpd(auVar11,auVar2);
      ret.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
           1.0;
      Eigen::internal::
      transform_right_product_impl<Eigen::Transform<double,_3,_2,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1>
      ::run((ResultType *)&normal_vector,transformation,&ret);
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (double)&camera;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (double)&normal_vector;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&p,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&local_168);
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&p);
      iVar6 = 0;
      local_1c0 = 0.0;
      dVar12 = 1.0;
      for (dVar10 = 0.4; (dVar3 = dVar10, iVar6 < max_steps && (dVar3 < (double)max_ray_length));
          dVar10 = dVar10 + dVar3) {
        local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = (double)&camera;
        local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = (double)&p;
        local_150 = dVar3;
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&normal_vector,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
                    *)&local_168);
        dVar10 = SDF(&normal_vector,primitives);
        if (dVar10 < (double)precision) {
          local_150 = ((dVar3 - local_1c0) * dVar12) / (dVar12 - (dVar10 - (double)precision)) +
                      local_1c0;
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = (double)&camera;
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = (double)&p;
          Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
          _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&ret,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
                      *)&local_168);
          SDFGradient(&normal_vector,&ret,primitives);
          Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&normal_vector);
          lVar4 = *local_78 * uVar8 + local_b0;
          *(float *)(uVar5 * 0xc + 8 + lVar4) =
               (float)normal_vector.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[1];
          *(ulong *)(uVar5 * 0xc + lVar4) =
               CONCAT44((float)normal_vector.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[0],
                        (float)normal_vector.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[2]);
          goto LAB_0010f0bf;
        }
        iVar6 = iVar6 + 1;
        dVar12 = dVar10;
        local_1c0 = dVar3;
      }
      lVar4 = *local_78 * uVar8 + local_b0;
      *(undefined8 *)(uVar5 * 0xc + lVar4) = 0x7fc000007fc00000;
      *(undefined4 *)(uVar5 * 0xc + 8 + lVar4) = 0x7fc00000;
LAB_0010f0bf:
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void RenderNormal(
    const Eigen::Affine3d &transformation, 
    const int rows, 
    const int cols, 
    Eigen::Vector4f &cam_params, 
    const int max_steps, 
    const float max_ray_length, 
    const float precision, 
    std::vector<Primitive*> &primitives,
    cv::Mat &Normals)
  {
    
    cv::Mat Nmap(rows, cols, CV_32FC3);
    const Eigen::Vector3d camera = transformation * Eigen::Vector3d(0.0,0.0,0.0);
    const Eigen::Vector3d viewAxis = (transformation * Eigen::Vector3d(0.0,0.0,1.0+1e-12) - camera).normalized(); 
    
    //Rendering loop
   #pragma omp parallel for collapse(2)
    for(int u = 0; u < rows; ++u)
    {
      for(int v = 0; v < cols; ++v)
      {
        bool hit = false;

        Eigen::Vector3d p = transformation*makeRay(u, v, 1.0, cam_params(0), cam_params(1), cam_params(2), cam_params(3)) - camera;
        p.normalize();
              
        double scaling = 0.4;
        double scaling_prev=0;
        double D = 1.0;
        int steps=0;
        while(steps<max_steps && scaling < max_ray_length && !hit)
        { 

          double D_prev = D;
          D = SDF(camera + p*scaling, primitives);
          if(D < precision)
          {
            scaling = scaling_prev + (scaling-scaling_prev)*D_prev/(D_prev - (D - precision));

            hit = true;
            Eigen::Vector3d normal_vector = SDFGradient(camera + p*scaling,primitives);            
            normal_vector.normalize();

            Nmap.at<cv::Vec3f>(u,v)[1]=(normal_vector(0));
            Nmap.at<cv::Vec3f>(u,v)[2]=(normal_vector(1));
            Nmap.at<cv::Vec3f>(u,v)[0]=(normal_vector(2));

            break;
          }
          scaling_prev = scaling;
          scaling += D;  
          ++steps;        
        }//ray
        if(!hit)     
        {
          Nmap.at<cv::Vec3f>(u,v)[0]=std::numeric_limits<float>::quiet_NaN();
          Nmap.at<cv::Vec3f>(u,v)[1]=std::numeric_limits<float>::quiet_NaN();
          Nmap.at<cv::Vec3f>(u,v)[2]=std::numeric_limits<float>::quiet_NaN();
        
        }//no hit
      }//col
    }//row 

    Normals = Nmap;
    return;
  }